

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O1

string * __thiscall
jsonnet::internal::jsonnet_fmt_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,AST *ast,Fodder *final_fodder,FmtOpts *opts
          )

{
  pointer pcVar1;
  _func_int **pp_Var2;
  string *psVar3;
  Allocator alloc;
  Unparser unparser;
  stringstream ss;
  AST *local_230;
  string *local_228;
  Allocator local_220;
  undefined1 local_1d8 [16];
  pointer pFStack_1c8;
  undefined4 local_1c0;
  undefined1 local_1b8 [24];
  pointer pFStack_1a0;
  undefined4 local_198;
  undefined1 local_194;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  local_190 [3];
  ios_base local_138 [264];
  
  local_220.internedIdentifiers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_220.internedIdentifiers._M_t._M_impl.super__Rb_tree_header._M_header;
  local_220.internedIdentifiers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_220.internedIdentifiers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_220.internedIdentifiers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_220.allocated.
  super__List_base<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&local_220.allocated;
  local_220.allocated.
  super__List_base<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>._M_impl.
  _M_node._M_size = 0;
  local_230 = (AST *)this;
  local_220.internedIdentifiers._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_220.internedIdentifiers._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_220.allocated.
  super__List_base<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev =
       local_220.allocated.
       super__List_base<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>._M_impl
       ._M_node.super__List_node_base._M_next;
  if (*(char *)((long)&(final_fodder->
                       super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       )._M_impl.super__Vector_impl_data._M_end_of_storage + 2) == '\x01') {
    local_1b8._0_8_ = &local_220;
    SortImports::file((SortImports *)local_1b8,&local_230);
  }
  remove_initial_newlines(local_230);
  if (*(int *)&(final_fodder->
               super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               )._M_impl.super__Vector_impl_data._M_finish != 0) {
    local_1b8._8_8_ = &local_220;
    local_1b8._16_8_ =
         (final_fodder->
         super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
         )._M_impl.super__Vector_impl_data._M_start;
    pFStack_1a0 = (final_fodder->
                  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
    local_198 = *(undefined4 *)
                 &(final_fodder->
                  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_1b8._0_8_ = &PTR_fodderElement_0023ca98;
    CompilerPass::file((CompilerPass *)local_1b8,&local_230,(Fodder *)ast);
  }
  local_1b8._16_8_ =
       (final_fodder->
       super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
       )._M_impl.super__Vector_impl_data._M_start;
  pFStack_1a0 = (final_fodder->
                super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                )._M_impl.super__Vector_impl_data._M_finish;
  local_198 = *(undefined4 *)
               &(final_fodder->
                super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_1b8._0_8_ = &PTR_fodderElement_0023cd58;
  local_228 = __return_storage_ptr__;
  local_1b8._8_8_ = &local_220;
  CompilerPass::file((CompilerPass *)local_1b8,&local_230,(Fodder *)ast);
  local_1b8._16_8_ =
       (final_fodder->
       super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
       )._M_impl.super__Vector_impl_data._M_start;
  pFStack_1a0 = (final_fodder->
                super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                )._M_impl.super__Vector_impl_data._M_finish;
  local_198 = *(undefined4 *)
               &(final_fodder->
                super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_1b8._0_8_ = &PTR_fodderElement_0023ceb8;
  local_190[0].
  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_190[0].
  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_190[0].
  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1b8._8_8_ = &local_220;
  CompilerPass::file((CompilerPass *)local_1b8,&local_230,(Fodder *)ast);
  local_1b8._0_8_ = &PTR_fodderElement_0023ceb8;
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  ~vector(local_190);
  local_1b8._16_8_ =
       (final_fodder->
       super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
       )._M_impl.super__Vector_impl_data._M_start;
  pFStack_1a0 = (final_fodder->
                super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                )._M_impl.super__Vector_impl_data._M_finish;
  local_198 = *(undefined4 *)
               &(final_fodder->
                super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_1b8._0_8_ = &PTR_fodderElement_0023d018;
  local_1b8._8_8_ = &local_220;
  CompilerPass::file((CompilerPass *)local_1b8,&local_230,(Fodder *)ast);
  local_1b8._16_8_ =
       (final_fodder->
       super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
       )._M_impl.super__Vector_impl_data._M_start;
  pFStack_1a0 = (final_fodder->
                super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                )._M_impl.super__Vector_impl_data._M_finish;
  local_198 = *(undefined4 *)
               &(final_fodder->
                super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_1b8._0_8_ = &PTR_fodderElement_0023d178;
  local_1b8._8_8_ = &local_220;
  CompilerPass::file((CompilerPass *)local_1b8,&local_230,(Fodder *)ast);
  local_1b8._16_8_ =
       (final_fodder->
       super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
       )._M_impl.super__Vector_impl_data._M_start;
  pFStack_1a0 = (final_fodder->
                super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                )._M_impl.super__Vector_impl_data._M_finish;
  local_198 = *(undefined4 *)
               &(final_fodder->
                super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_1b8._0_8_ = &PTR_fodderElement_0023d2d8;
  local_1b8._8_8_ = &local_220;
  CompilerPass::file((CompilerPass *)local_1b8,&local_230,(Fodder *)ast);
  if (*(char *)((long)&(final_fodder->
                       super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       )._M_impl.super__Vector_impl_data._M_finish + 6) == '\x01') {
    local_1b8._16_8_ =
         (final_fodder->
         super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
         )._M_impl.super__Vector_impl_data._M_start;
    pFStack_1a0 = (final_fodder->
                  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
    local_198 = *(undefined4 *)
                 &(final_fodder->
                  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_1b8._0_8_ = &PTR_fodderElement_0023d438;
    local_1b8._8_8_ = &local_220;
    CompilerPass::file((CompilerPass *)local_1b8,&local_230,(Fodder *)ast);
  }
  else if (*(char *)((long)&(final_fodder->
                            super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                            )._M_impl.super__Vector_impl_data._M_finish + 7) == '\x01') {
    local_1b8._16_8_ =
         (final_fodder->
         super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
         )._M_impl.super__Vector_impl_data._M_start;
    pFStack_1a0 = (final_fodder->
                  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
    local_198 = *(undefined4 *)
                 &(final_fodder->
                  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_1b8._0_8_ = &PTR_fodderElement_0023d598;
    local_190[0].
    super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_190[0].
    super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_190[0].
    super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1b8._8_8_ = &local_220;
    StripAllButComments::file((StripAllButComments *)local_1b8,&local_230,(Fodder *)ast);
    local_1b8._0_8_ = &PTR_fodderElement_0023d598;
    std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ::~vector(local_190);
  }
  else if (*(char *)&(final_fodder->
                     super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                     )._M_impl.super__Vector_impl_data._M_end_of_storage == '\x01') {
    local_1b8._16_8_ =
         (final_fodder->
         super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
         )._M_impl.super__Vector_impl_data._M_start;
    pFStack_1a0 = (final_fodder->
                  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
    local_198 = *(undefined4 *)
                 &(final_fodder->
                  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_1b8._0_8_ = &PTR_fodderElement_0023d6f8;
    local_1b8._8_8_ = &local_220;
    CompilerPass::file((CompilerPass *)local_1b8,&local_230,(Fodder *)ast);
  }
  if (*(char *)((long)&(final_fodder->
                       super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       )._M_impl.super__Vector_impl_data._M_end_of_storage + 1) == '\x01') {
    local_1b8._16_8_ =
         (final_fodder->
         super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
         )._M_impl.super__Vector_impl_data._M_start;
    pFStack_1a0 = (final_fodder->
                  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
    local_198 = *(undefined4 *)
                 &(final_fodder->
                  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_1b8._0_8_ = &PTR_fodderElement_0023d858;
    local_1b8._8_8_ = &local_220;
    CompilerPass::file((CompilerPass *)local_1b8,&local_230,(Fodder *)ast);
  }
  if (*(char *)&(final_fodder->
                super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                )._M_impl.super__Vector_impl_data._M_start != 'l') {
    local_1b8._16_8_ =
         (final_fodder->
         super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
         )._M_impl.super__Vector_impl_data._M_start;
    pFStack_1a0 = (final_fodder->
                  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
    local_198 = *(undefined4 *)
                 &(final_fodder->
                  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_1b8._0_8_ = &PTR_fodderElement_0023d9b8;
    local_1b8._8_8_ = &local_220;
    CompilerPass::file((CompilerPass *)local_1b8,&local_230,(Fodder *)ast);
  }
  if (*(char *)((long)&(final_fodder->
                       super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       )._M_impl.super__Vector_impl_data._M_start + 1) != 'l') {
    local_1b8._16_8_ =
         (final_fodder->
         super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
         )._M_impl.super__Vector_impl_data._M_start;
    pFStack_1a0 = (final_fodder->
                  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
    local_198 = *(undefined4 *)
                 &(final_fodder->
                  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_1b8._0_8_ = &PTR_fodderElement_0023db18;
    local_194 = 1;
    local_1b8._8_8_ = &local_220;
    CompilerPass::file((CompilerPass *)local_1b8,&local_230,(Fodder *)ast);
  }
  psVar3 = local_228;
  if (*(int *)((long)&(final_fodder->
                      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                      )._M_impl.super__Vector_impl_data._M_start + 4) != 0) {
    local_1b8._0_8_ = &PTR_file_0023dc78;
    local_1b8._8_8_ =
         (final_fodder->
         super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
         )._M_impl.super__Vector_impl_data._M_start;
    local_1b8._16_8_ =
         (final_fodder->
         super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    pFStack_1a0 = (pointer)(ulong)*(uint *)&(final_fodder->
                                            super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                            )._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_1d8._0_4_ = 0;
    local_1d8._4_4_ = 0;
    FixIndentation::expr((FixIndentation *)local_1b8,local_230,(Indent *)local_1d8,false);
    FixIndentation::setIndents((FixIndentation *)local_1b8,(Fodder *)ast,0,0);
  }
  pp_Var2 = (_func_int **)(ast->location).file._M_dataplus._M_p;
  if (ast->_vptr_AST != pp_Var2) {
    pcVar1 = (pointer)((long)pp_Var2 + -0x24);
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = '\0';
    pcVar1[3] = '\0';
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  local_1d8._8_8_ =
       (final_fodder->
       super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
       )._M_impl.super__Vector_impl_data._M_start;
  pFStack_1c8 = (final_fodder->
                super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                )._M_impl.super__Vector_impl_data._M_finish;
  local_1c0 = *(undefined4 *)
               &(final_fodder->
                super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_1d8._0_8_ = (long)local_1b8 + 0x10;
  Unparser::unparse((Unparser *)local_1d8,local_230,false);
  fodder_fill((ostream *)local_1d8._0_8_,(Fodder *)ast,true,false,true);
  pp_Var2 = (_func_int **)(ast->location).file._M_dataplus._M_p;
  if ((ast->_vptr_AST == pp_Var2) || (*(int *)(pp_Var2 + -5) == 1)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)((long)local_1b8 + 0x10),"\n",1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
  Allocator::~Allocator(&local_220);
  return psVar3;
}

Assistant:

std::string jsonnet_fmt(AST *ast, Fodder &final_fodder, const FmtOpts &opts)
{
    Allocator alloc;

    // Passes to enforce style on the AST.
    if (opts.sortImports)
        SortImports(alloc).file(ast);
    remove_initial_newlines(ast);
    if (opts.maxBlankLines > 0)
        EnforceMaximumBlankLines(alloc, opts).file(ast, final_fodder);
    FixNewlines(alloc, opts).file(ast, final_fodder);
    FixTrailingCommas(alloc, opts).file(ast, final_fodder);
    FixParens(alloc, opts).file(ast, final_fodder);
    FixPlusObject(alloc, opts).file(ast, final_fodder);
    NoRedundantSliceColon(alloc, opts).file(ast, final_fodder);
    if (opts.stripComments)
        StripComments(alloc, opts).file(ast, final_fodder);
    else if (opts.stripAllButComments)
        StripAllButComments(alloc, opts).file(ast, final_fodder);
    else if (opts.stripEverything)
        StripEverything(alloc, opts).file(ast, final_fodder);
    if (opts.prettyFieldNames)
        PrettyFieldNames(alloc, opts).file(ast, final_fodder);
    if (opts.stringStyle != 'l')
        EnforceStringStyle(alloc, opts).file(ast, final_fodder);
    if (opts.commentStyle != 'l')
        EnforceCommentStyle(alloc, opts).file(ast, final_fodder);
    if (opts.indent > 0)
        FixIndentation(opts).file(ast, final_fodder);
    remove_extra_trailing_newlines(final_fodder);

    std::stringstream ss;
    Unparser unparser(ss, opts);
    unparser.unparse(ast, false);
    unparser.fill_final(final_fodder, true, false);
    if (final_fodder.empty() || final_fodder.back().kind == FodderElement::INTERSTITIAL) {
        ss << "\n";
    }
    return ss.str();
}